

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::transpose(Matrix<double,__1,__1> *this)

{
  int iVar1;
  double *pdVar2;
  double num;
  int j;
  int i;
  Matrix<double,__1,__1> *this_local;
  Matrix<double,__1,__1> result;
  
  Matrix((Matrix<double,__1,__1> *)&this_local);
  resize((Matrix<double,__1,__1> *)&this_local,this->cols,this->rows);
  num._4_4_ = 0;
  while( true ) {
    iVar1 = row((Matrix<double,__1,__1> *)&this_local);
    if (iVar1 <= num._4_4_) break;
    num._0_4_ = 0;
    while( true ) {
      iVar1 = col((Matrix<double,__1,__1> *)&this_local);
      if (iVar1 <= num._0_4_) break;
      pdVar2 = operator()(this,num._0_4_,num._4_4_);
      SetElement((Matrix<double,__1,__1> *)&this_local,num._4_4_,num._0_4_,*pdVar2);
      num._0_4_ = num._0_4_ + 1;
    }
    num._4_4_ = num._4_4_ + 1;
  }
  return _this_local;
}

Assistant:

Matrix<Type, _1, _0> Matrix<Type, _0, _1>::transpose()
{
    Matrix<Type, _1, _0> result;
    if(_1 == Dynamic || _0 == Dynamic)
        result.resize(this->cols, this->rows);
    for(int i = 0; i < result.row(); ++i)
    {
        for(int j = 0; j < result.col(); ++j)
        {
            Type num = this->operator()(j, i);
            result.SetElement(i, j, num);
        }
    }
    return result;
}